

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

void Abc_NtkRetimeTranferToCopy(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pLatch;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < pNtk->vObjs->nSize; i_00 = i_00 + 1) {
    pLatch = Abc_NtkObj(pNtk,i_00);
    if ((pLatch != (Abc_Obj_t *)0x0) && ((*(uint *)&pLatch->field_0x14 & 0xf) == 8)) {
      aVar1._0_4_ = Abc_LatchIsInit1(pLatch);
      aVar1._4_4_ = 0;
      pLatch->field_6 = aVar1;
    }
  }
  return;
}

Assistant:

void Abc_NtkRetimeTranferToCopy( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_LatchIsInit1(pObj);
}